

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Dn dn)

{
  Syntax SVar1;
  char *pcVar2;
  char cVar3;
  
  SVar1 = this->style->syntax;
  if (SVar1 == MOIRA_MIT) {
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = '%';
  }
  else {
    cVar3 = 'd';
    if (SVar1 == GNU) goto LAB_0013009a;
    if (SVar1 == GNU_MIT) {
      pcVar2 = this->ptr;
      this->ptr = pcVar2 + 1;
      *pcVar2 = '%';
      goto LAB_0013009a;
    }
  }
  cVar3 = 'D';
LAB_0013009a:
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = cVar3;
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = (char)dn.raw + '0';
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Dn dn)
{
    switch (style.syntax) {

        case Syntax::GNU_MIT:      *ptr++ = '%'; [[fallthrough]];
       case Syntax::GNU:          *ptr++ = 'd'; *ptr++ = '0' + (char)dn.raw; break;
        case Syntax::MOIRA_MIT:    *ptr++ = '%'; [[fallthrough]];
        
        default:
            *ptr++ = 'D'; *ptr++ = '0' + (char)dn.raw; break;
    }

    return *this;
}